

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseTimeOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *this_00;
  string *s;
  uint uVar1;
  bool bVar2;
  TimeOption option;
  int value_00;
  InputError *pIVar3;
  uint uVar4;
  size_type *local_150;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string s2;
  string s1;
  string keyword;
  string timeUnits;
  string timeStr;
  
  s = (tokenList->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(tokenList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)s) >> 5);
  if (1 < (int)uVar4) {
    s2.field_2._8_8_ = &s1._M_string_length;
    s1._M_dataplus._M_p = (pointer)0x0;
    s1._M_string_length._0_1_ = 0;
    local_d0 = (undefined1  [8])&s2._M_string_length;
    s2._M_dataplus._M_p = (pointer)0x0;
    s1.field_2._8_8_ = &keyword._M_string_length;
    keyword._M_dataplus._M_p = (pointer)0x0;
    s2._M_string_length._0_1_ = 0;
    keyword._M_string_length._0_1_ = 0;
    local_150 = &value._M_string_length;
    value._M_dataplus._M_p = (pointer)0x0;
    value._M_string_length._0_1_ = 0;
    Utilities::upperCase((string *)((long)&timeUnits.field_2 + 8),s);
    std::__cxx11::string::operator=
              ((string *)(s2.field_2._M_local_buf + 8),
               (string *)(timeUnits.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(timeUnits.field_2._M_local_buf + 8));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (s2.field_2._M_local_buf + 8),"DURATION");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&s2.field_2 + 8),"STATISTIC"), bVar2)) {
      std::__cxx11::string::assign(s1.field_2._M_local_buf + 8);
      uVar1 = 1;
    }
    else {
      Utilities::upperCase((string *)((long)&timeUnits.field_2 + 8),s + 1);
      this_00 = (string *)(timeUnits.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)local_d0,this_00);
      std::__cxx11::string::~string(this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&keyword.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&s2.field_2 + 8),"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&timeUnits.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&keyword.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::__cxx11::string::operator=((string *)(s1.field_2._M_local_buf + 8),this_00);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
      uVar1 = 2;
    }
    if (uVar1 < uVar4) {
      option = Utilities::findFullMatch((string *)((long)&s1.field_2 + 8),timeOptionKeywords);
      if ((int)option < 0) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)(value.field_2._M_local_buf + 8),
                   (string *)(s1.field_2._M_local_buf + 8));
        InputError::InputError(pIVar3,3,(string *)((long)&value.field_2 + 8));
        __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
      }
      if (option != REPORT_STATISTIC) {
        std::__cxx11::string::string
                  ((string *)(timeUnits.field_2._M_local_buf + 8),
                   (string *)((long)&(s->_M_dataplus)._M_p + (ulong)(uVar1 << 5)));
        std::__cxx11::string::string
                  ((string *)(keyword.field_2._M_local_buf + 8),"",(allocator *)&local_f0);
        if (uVar1 + 1 < uVar4) {
          std::__cxx11::string::_M_assign((string *)(keyword.field_2._M_local_buf + 8));
        }
        value_00 = Utilities::getSeconds
                             ((string *)((long)&timeUnits.field_2 + 8),
                              (string *)((long)&keyword.field_2 + 8));
        if (value_00 < 0) {
          pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
          std::operator+(&local_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&timeUnits.field_2 + 8)," ");
          std::operator+(&local_110,&local_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&keyword.field_2 + 8));
          InputError::InputError(pIVar3,7,&local_110);
          __cxa_throw(pIVar3,&InputError::typeinfo,ENerror::~ENerror);
        }
        Options::setOption(&network->options,option,value_00);
        std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(timeUnits.field_2._M_local_buf + 8));
      }
    }
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)(s1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void OptionParser::parseTimeOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    int nTokens = (int)tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords

    string s1, s2, keyword, value;
    s1 = Utilities::upperCase(tokens[0]);
    int i = 1;

    // ... check for single keyword option (for EPANET 2 compatibility)

    if (s1 == w_DURATION) keyword = timeOptionKeywords[Options::TOTAL_DURATION];
    else if (s1 == w_STATISTIC) keyword = timeOptionKeywords[Options::REPORT_STATISTIC];

    // ... otherwise form option keyword

    else
    {
        s2 = Utilities::upperCase(tokens[1]);
        keyword = s1 + "_" + s2;
        i = 2;
    }
    if ( i >= nTokens ) return;


    // ... find which time option we have

    int option = Utilities::findFullMatch(keyword, timeOptionKeywords);
    if ( option < 0 ) throw InputError(InputError::INVALID_KEYWORD, keyword);

    // ... skip STATISTIC option

    if (option == Options::REPORT_STATISTIC) return;

    // ... create strings to hold a time value and its units

    string timeStr = tokens[i];
    string timeUnits = "";
    if ( nTokens > ++i ) timeUnits = tokens[i];

    // ... convert time value string to seconds

    int seconds = Utilities::getSeconds(timeStr, timeUnits);
    if (seconds < 0)
    {
        throw InputError(InputError::INVALID_TIME, timeStr + " " + timeUnits);
    }
    network->options.setOption((Options::TimeOption)option, seconds);
}